

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O3

Aig_Man_t *
Saig_ManUnrollWithCex(Aig_Man_t *pAig,Abc_Cex_t *pCex,int nInputs,Vec_Int_t **pvMapPiF2A)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  void *pvVar8;
  void *pvVar9;
  Aig_Man_t *p;
  size_t sVar10;
  char *pcVar11;
  ulong uVar12;
  Aig_Obj_t *pAVar13;
  uint uVar14;
  ulong uVar15;
  char *pcVar16;
  Aig_Obj_t *p1;
  long lVar17;
  long lVar18;
  char *__assertion;
  int i;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  int local_80;
  void *local_78;
  void *local_60;
  
  if (pAig->nTruePis != pCex->nPis) {
    __assert_fail("Saig_ManPiNum(pAig) == pCex->nPis",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSat.c"
                  ,0x111,
                  "Aig_Man_t *Saig_ManUnrollWithCex(Aig_Man_t *, Abc_Cex_t *, int, Vec_Int_t **)");
  }
  if (pAig->nRegs != pCex->nRegs) {
    __assertion = "Saig_ManRegNum(pAig) == pCex->nRegs";
    pcVar11 = 
    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSat.c"
    ;
    pcVar16 = "Aig_Man_t *Saig_ManUnrollWithCex(Aig_Man_t *, Abc_Cex_t *, int, Vec_Int_t **)";
LAB_00595eaa:
    __assert_fail(__assertion,pcVar11,0x112,pcVar16);
  }
  iVar1 = pCex->iPo;
  if (((long)iVar1 < 0) || (pAig->nTruePos <= iVar1)) {
    __assert_fail("pCex->iPo >= 0 && pCex->iPo < Saig_ManPoNum(pAig)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSat.c"
                  ,0x113,
                  "Aig_Man_t *Saig_ManUnrollWithCex(Aig_Man_t *, Abc_Cex_t *, int, Vec_Int_t **)");
  }
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 1000;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(4000);
  pVVar6->pArray = piVar7;
  *pvMapPiF2A = pVVar6;
  uVar5 = pCex->iFrame;
  uVar4 = uVar5 + 1;
  uVar14 = 8;
  if (6 < (ulong)uVar5) {
    uVar14 = uVar4;
  }
  if (uVar14 == 0) {
    local_78 = (void *)0x0;
  }
  else {
    local_78 = malloc((long)(int)uVar14 * 8);
  }
  uVar21 = (ulong)uVar4;
  if (uVar5 < 0x7fffffff) {
    uVar19 = 0;
    do {
      pvVar8 = calloc(1,0x10);
      *(void **)((long)local_78 + uVar19 * 8) = pvVar8;
      uVar19 = uVar19 + 1;
    } while (uVar21 != uVar19);
  }
  if (uVar14 == 0) {
    pvVar8 = (void *)0x0;
  }
  else {
    pvVar8 = malloc((long)(int)uVar14 << 3);
  }
  if (uVar5 < 0x7fffffff) {
    uVar19 = 0;
    do {
      pvVar9 = calloc(1,0x10);
      *(void **)((long)pvVar8 + uVar19 * 8) = pvVar9;
      uVar19 = uVar19 + 1;
    } while (uVar21 != uVar19);
  }
  if (iVar1 < pAig->vCos->nSize) {
    iVar1 = *(int *)((long)pAig->vCos->pArray[iVar1] + 0x24);
    local_60 = local_78;
    if (uVar5 == 0x7fffffff) {
      if (local_78 == (void *)0x0) {
        local_60 = malloc(0xfffffffc00000000);
      }
      else {
        local_60 = realloc(local_78,0xfffffffc00000000);
      }
      lVar17 = 0;
      do {
        pvVar9 = calloc(1,0x10);
        *(void **)((long)local_78 + lVar17 * 8 + -0x400000000) = pvVar9;
        lVar17 = lVar17 + 1;
      } while ((int)lVar17 != 0);
    }
    if (0x7ffffffe < uVar5) {
LAB_00595eb4:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecVec.h"
                    ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
    }
    Vec_IntPush(*(Vec_Int_t **)((long)local_78 + (ulong)uVar5 * 8),iVar1);
    lVar17 = (long)pCex->iFrame;
    if (-1 < (long)pCex->iFrame) {
      do {
        Aig_ManIncrementTravId(pAig);
        if ((long)uVar21 <= lVar17) goto LAB_00595eb4;
        lVar18 = *(long *)((long)local_78 + lVar17 * 8);
        if (0 < *(int *)(lVar18 + 4)) {
          lVar20 = 0;
          do {
            pVVar2 = pAig->vObjs;
            if (pVVar2 == (Vec_Ptr_t *)0x0) {
              pAVar13 = (Aig_Obj_t *)0x0;
            }
            else {
              uVar5 = *(uint *)(*(long *)(lVar18 + 8) + lVar20 * 4);
              if (((int)uVar5 < 0) || (pVVar2->nSize <= (int)uVar5)) goto LAB_00595e38;
              pAVar13 = (Aig_Obj_t *)pVVar2->pArray[uVar5];
            }
            if (lVar17 == 0) {
              pVVar6 = (Vec_Int_t *)0x0;
            }
            else {
              pVVar6 = *(Vec_Int_t **)((long)local_78 + lVar17 * 8 + -8);
            }
            Saig_ManUnrollCollect_rec
                      (pAig,pAVar13,*(Vec_Int_t **)((long)pvVar8 + lVar17 * 8),pVVar6);
            lVar20 = lVar20 + 1;
          } while (lVar20 < *(int *)(lVar18 + 4));
        }
        bVar3 = 0 < lVar17;
        lVar17 = lVar17 + -1;
      } while (bVar3);
    }
    p = Aig_ManStart(10000);
    pcVar16 = pAig->pName;
    if (pcVar16 == (char *)0x0) {
      pcVar11 = (char *)0x0;
    }
    else {
      sVar10 = strlen(pcVar16);
      pcVar11 = (char *)malloc(sVar10 + 1);
      strcpy(pcVar11,pcVar16);
    }
    p->pName = pcVar11;
    pcVar16 = pAig->pSpec;
    if (pcVar16 == (char *)0x0) {
      pcVar11 = (char *)0x0;
    }
    else {
      sVar10 = strlen(pcVar16);
      pcVar11 = (char *)malloc(sVar10 + 1);
      strcpy(pcVar11,pcVar16);
    }
    p->pSpec = pcVar11;
    if (0 < pAig->nRegs) {
      uVar5 = 0;
      do {
        uVar14 = pAig->nTruePis + uVar5;
        if (((int)uVar14 < 0) || (pAig->vCis->nSize <= (int)uVar14)) goto LAB_00595e38;
        *(ulong *)((long)pAig->vCis->pArray[uVar14] + 0x28) =
             (ulong)(((uint)(&pCex[1].iPo)[uVar5 >> 5] >> (uVar5 & 0x1f) & 1) == 0) ^
             (ulong)p->pConst1;
        uVar5 = uVar5 + 1;
      } while ((int)uVar5 < pAig->nRegs);
    }
    uVar5 = pCex->iFrame;
    if (-1 < (int)uVar5) {
      uVar19 = 0;
      if (0 < (int)uVar4) {
        uVar19 = (ulong)uVar4;
      }
      uVar12 = 0;
      do {
        if (uVar12 == uVar19) goto LAB_00595eb4;
        lVar17 = *(long *)((long)pvVar8 + uVar12 * 8);
        if (0 < *(int *)(lVar17 + 4)) {
          lVar18 = 0;
          do {
            pVVar2 = pAig->vObjs;
            if (pVVar2 == (Vec_Ptr_t *)0x0) {
              piVar7 = (int *)0x0;
            }
            else {
              uVar5 = *(uint *)(*(long *)(lVar17 + 8) + lVar18 * 4);
              if (((int)uVar5 < 0) || (pVVar2->nSize <= (int)uVar5)) goto LAB_00595e38;
              piVar7 = (int *)pVVar2->pArray[uVar5];
            }
            if (((uint)*(undefined8 *)(piVar7 + 6) & 7) - 7 < 0xfffffffe) {
              uVar5 = (uint)*(undefined8 *)(piVar7 + 6) & 7;
              if (uVar5 == 3) {
                if (((ulong)piVar7 & 1) != 0) goto LAB_00595e76;
                uVar15 = *(ulong *)(piVar7 + 2) & 0xfffffffffffffffe;
                if (uVar15 == 0) {
                  pAVar13 = (Aig_Obj_t *)0x0;
                }
                else {
                  pAVar13 = (Aig_Obj_t *)
                            ((ulong)((uint)*(ulong *)(piVar7 + 2) & 1) ^ *(ulong *)(uVar15 + 0x28));
                }
                goto LAB_00595be3;
              }
              if (((ulong)piVar7 & 1) != 0) {
                __assertion = "!Aig_IsComplement(pObj)";
                pcVar11 = 
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                ;
                pcVar16 = "int Aig_ObjIsConst1(Aig_Obj_t *)";
                goto LAB_00595eaa;
              }
              if (uVar5 == 2) {
                iVar1 = *piVar7;
                if (iVar1 < pAig->nTruePis) {
                  local_80 = (int)uVar12;
                  if (iVar1 < nInputs) {
                    uVar5 = iVar1 + pCex->nRegs + pCex->nPis * local_80;
                    *(ulong *)(piVar7 + 10) =
                         (ulong)(((uint)(&pCex[1].iPo)[(int)uVar5 >> 5] >> (uVar5 & 0x1f) & 1) == 0)
                         ^ (ulong)p->pConst1;
                  }
                  else {
                    pAVar13 = Aig_ObjCreateCi(p);
                    *(Aig_Obj_t **)(piVar7 + 10) = pAVar13;
                    if (0xfffffffd < (piVar7[6] & 7U) - 7) {
                      __assert_fail("!Aig_ObjIsNode(pObj)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                                    ,0x11d,"int Aig_ObjCioId(Aig_Obj_t *)");
                    }
                    Vec_IntPush(*pvMapPiF2A,*piVar7);
                    Vec_IntPush(*pvMapPiF2A,local_80);
                  }
                }
              }
              else if (uVar5 == 1) {
                pAVar13 = p->pConst1;
                goto LAB_00595be3;
              }
            }
            else {
              if (((ulong)piVar7 & 1) != 0) {
LAB_00595e76:
                __assert_fail("!Aig_IsComplement(pObj)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                              ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
              }
              uVar15 = *(ulong *)(piVar7 + 2) & 0xfffffffffffffffe;
              if (uVar15 == 0) {
                pAVar13 = (Aig_Obj_t *)0x0;
              }
              else {
                pAVar13 = (Aig_Obj_t *)
                          ((ulong)((uint)*(ulong *)(piVar7 + 2) & 1) ^ *(ulong *)(uVar15 + 0x28));
              }
              uVar15 = *(ulong *)(piVar7 + 4) & 0xfffffffffffffffe;
              if (uVar15 == 0) {
                p1 = (Aig_Obj_t *)0x0;
              }
              else {
                p1 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)(piVar7 + 4) & 1) ^ *(ulong *)(uVar15 + 0x28));
              }
              pAVar13 = Aig_And(p,pAVar13,p1);
LAB_00595be3:
              *(Aig_Obj_t **)(piVar7 + 10) = pAVar13;
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 < *(int *)(lVar17 + 4));
          uVar5 = pCex->iFrame;
        }
        if (uVar12 == uVar5) break;
        if ((long)(int)uVar4 <= (long)uVar12) goto LAB_00595eb4;
        lVar17 = *(long *)((long)local_78 + uVar12 * 8);
        if (0 < *(int *)(lVar17 + 4)) {
          lVar18 = 0;
          do {
            pVVar2 = pAig->vObjs;
            if (pVVar2 == (Vec_Ptr_t *)0x0) {
              piVar7 = (int *)0x0;
            }
            else {
              uVar5 = *(uint *)(*(long *)(lVar17 + 8) + lVar18 * 4);
              if (((int)uVar5 < 0) || (pVVar2->nSize <= (int)uVar5)) goto LAB_00595e38;
              piVar7 = (int *)pVVar2->pArray[uVar5];
            }
            if (((piVar7[6] & 7U) != 3) || (*piVar7 < pAig->nTruePos)) {
              __assert_fail("Saig_ObjIsLi(p, pObj)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saig.h"
                            ,0x57,"Aig_Obj_t *Saig_ObjLiToLo(Aig_Man_t *, Aig_Obj_t *)");
            }
            uVar5 = (*piVar7 - pAig->nTruePos) + pAig->nTruePis;
            if (((int)uVar5 < 0) || (pAig->vCis->nSize <= (int)uVar5)) goto LAB_00595e38;
            *(undefined8 *)((long)pAig->vCis->pArray[uVar5] + 0x28) = *(undefined8 *)(piVar7 + 10);
            lVar18 = lVar18 + 1;
          } while (lVar18 < *(int *)(lVar17 + 4));
          uVar5 = pCex->iFrame;
        }
        bVar3 = (long)uVar12 < (long)(int)uVar5;
        uVar12 = uVar12 + 1;
      } while (bVar3);
    }
    iVar1 = pCex->iPo;
    if ((-1 < (long)iVar1) && (iVar1 < pAig->vCos->nSize)) {
      Aig_ObjCreateCo(p,(Aig_Obj_t *)(*(ulong *)((long)pAig->vCos->pArray[iVar1] + 0x28) ^ 1));
      uVar19 = 0;
      Aig_ManSetRegNum(p,0);
      do {
        pvVar9 = *(void **)((long)local_78 + uVar19 * 8);
        if (pvVar9 != (void *)0x0) {
          if (*(void **)((long)pvVar9 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar9 + 8));
          }
          free(pvVar9);
        }
        uVar19 = uVar19 + 1;
      } while (uVar21 != uVar19);
      if (local_60 != (void *)0x0) {
        free(local_60);
      }
      uVar21 = 1;
      if (1 < (int)uVar4) {
        uVar21 = (ulong)uVar4;
      }
      uVar19 = 0;
      do {
        pvVar9 = *(void **)((long)pvVar8 + uVar19 * 8);
        if (pvVar9 != (void *)0x0) {
          if (*(void **)((long)pvVar9 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar9 + 8));
          }
          free(pvVar9);
        }
        uVar19 = uVar19 + 1;
      } while (uVar21 != uVar19);
      free(pvVar8);
      Aig_ManCleanup(p);
      return p;
    }
  }
LAB_00595e38:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Aig_Man_t * Saig_ManUnrollWithCex( Aig_Man_t * pAig, Abc_Cex_t * pCex, int nInputs, Vec_Int_t ** pvMapPiF2A )
{
    Aig_Man_t * pFrames;     // unrolled timeframes
    Vec_Vec_t * vFrameCos;   // the list of COs per frame
    Vec_Vec_t * vFrameObjs;  // the list of objects per frame
    Vec_Int_t * vRoots, * vObjs;
    Aig_Obj_t * pObj;
    int i, f;
    // sanity checks
    assert( Saig_ManPiNum(pAig) == pCex->nPis );
    assert( Saig_ManRegNum(pAig) == pCex->nRegs );
    assert( pCex->iPo >= 0 && pCex->iPo < Saig_ManPoNum(pAig) );

    // map PIs of the unrolled frames into PIs of the original design
    *pvMapPiF2A = Vec_IntAlloc( 1000 );

    // collect COs and Objs visited in each frame
    vFrameCos  = Vec_VecStart( pCex->iFrame+1 );
    vFrameObjs = Vec_VecStart( pCex->iFrame+1 );
    // initialized the topmost frame
    pObj = Aig_ManCo( pAig, pCex->iPo );
    Vec_VecPushInt( vFrameCos, pCex->iFrame, Aig_ObjId(pObj) );
    for ( f = pCex->iFrame; f >= 0; f-- )
    {
        // collect nodes starting from the roots
        Aig_ManIncrementTravId( pAig );
        vRoots = Vec_VecEntryInt( vFrameCos, f );
        Aig_ManForEachObjVec( vRoots, pAig, pObj, i )
            Saig_ManUnrollCollect_rec( pAig, pObj, 
                Vec_VecEntryInt(vFrameObjs, f),
                (Vec_Int_t *)(f ? Vec_VecEntry(vFrameCos, f-1) : NULL) );
    }

    // derive unrolled timeframes
    pFrames = Aig_ManStart( 10000 );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    pFrames->pSpec = Abc_UtilStrsav( pAig->pSpec );
    // initialize the flops 
    Saig_ManForEachLo( pAig, pObj, i )
        pObj->pData = Aig_NotCond( Aig_ManConst1(pFrames), !Abc_InfoHasBit(pCex->pData, i) );
    // iterate through the frames
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        // construct
        vObjs = Vec_VecEntryInt( vFrameObjs, f );
        Aig_ManForEachObjVec( vObjs, pAig, pObj, i )
        {
            if ( Aig_ObjIsNode(pObj) )
                pObj->pData = Aig_And( pFrames, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
            else if ( Aig_ObjIsCo(pObj) )
                pObj->pData = Aig_ObjChild0Copy(pObj);
            else if ( Aig_ObjIsConst1(pObj) )
                pObj->pData = Aig_ManConst1(pFrames);
            else if ( Saig_ObjIsPi(pAig, pObj) )
            {
                if ( Aig_ObjCioId(pObj) < nInputs )
                {
                    int iBit = pCex->nRegs + f * pCex->nPis + Aig_ObjCioId(pObj);
                    pObj->pData = Aig_NotCond( Aig_ManConst1(pFrames), !Abc_InfoHasBit(pCex->pData, iBit) );
                }
                else
                {
                    pObj->pData = Aig_ObjCreateCi( pFrames );
                    Vec_IntPush( *pvMapPiF2A, Aig_ObjCioId(pObj) );
                    Vec_IntPush( *pvMapPiF2A, f );
                }
            }
        }
        if ( f == pCex->iFrame )
            break;
        // transfer
        vRoots = Vec_VecEntryInt( vFrameCos, f );
        Aig_ManForEachObjVec( vRoots, pAig, pObj, i )
            Saig_ObjLiToLo( pAig, pObj )->pData = pObj->pData;
    }
    // create output
    pObj = Aig_ManCo( pAig, pCex->iPo );
    Aig_ObjCreateCo( pFrames, Aig_Not((Aig_Obj_t *)pObj->pData) );
    Aig_ManSetRegNum( pFrames, 0 );
    // cleanup
    Vec_VecFree( vFrameCos );
    Vec_VecFree( vFrameObjs );
    // finallize
    Aig_ManCleanup( pFrames );
    // return
    return pFrames;
}